

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS
ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_NODE ref_node)

{
  int insert_node;
  REF_DBL *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  REF_INT new_node;
  REF_NODE local_78;
  REF_DBL *local_70;
  REF_DBL box [6];
  
  local_70 = bbox;
  if (ref_oct->children[node * 8] == -1) {
    local_78 = ref_node;
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      if (ref_oct->nodes[node * 0x1b + lVar7] == -1) {
        insert_node = ref_oct->nnode;
        ref_oct->nnode = insert_node + 1;
        uVar3 = ref_node_add(local_78,(long)insert_node,&new_node);
        if (uVar3 != 0) {
          pcVar6 = "add node";
          uVar5 = 0x11d;
          goto LAB_00171965;
        }
        if (insert_node != new_node) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x11e,"ref_oct_unique_corner_nodes_node","expects to match",(long)insert_node,
                 (long)new_node);
          return 1;
        }
        RVar2 = ref_oct_bbox_corner(local_70,(REF_INT)lVar7,box);
        if (RVar2 != 0) {
          pcVar6 = "corner xyz";
          uVar5 = 0x11f;
          goto LAB_00171933;
        }
        pRVar1 = local_78->real;
        lVar4 = (long)new_node;
        pRVar1[lVar4 * 0xf] = box[0];
        pRVar1[lVar4 * 0xf + 1] = box[1];
        pRVar1[lVar4 * 0xf + 2] = box[2];
        uVar3 = ref_oct_set_node_at(ref_oct,insert_node,box);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x123,"ref_oct_unique_corner_nodes_node",(ulong)uVar3,"set node");
          return 1;
        }
        if (ref_oct->nodes[node * 0x1b + lVar7] == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x125,"ref_oct_unique_corner_nodes_node","self not set");
          return 1;
        }
      }
    }
  }
  else {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      RVar2 = ref_oct_child_bbox(local_70,(REF_INT)lVar7,box);
      if (RVar2 != 0) {
        pcVar6 = "bbox";
        uVar5 = 299;
LAB_00171933:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar5
               ,"ref_oct_unique_corner_nodes_node",1,pcVar6);
        return 1;
      }
      uVar3 = ref_oct_unique_corner_nodes_node
                        (ref_oct,ref_oct->children[node * 8 + lVar7],box,ref_node);
      if (uVar3 != 0) {
        pcVar6 = "recurse";
        uVar5 = 0x12f;
LAB_00171965:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar5
               ,"ref_oct_unique_corner_nodes_node",(ulong)uVar3,pcVar6);
        return uVar3;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,
                                                           REF_INT node,
                                                           REF_DBL *bbox,
                                                           REF_NODE ref_node) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    for (corner = 0; corner < 8; corner++) {
      if (REF_EMPTY == ref_oct_c2n(ref_oct, corner, node)) {
        REF_INT new_node;
        REF_DBL xyz[3];
        REF_INT insert_node;
        insert_node = ref_oct_nnode(ref_oct);
        ref_oct_nnode(ref_oct)++;
        RSS(ref_node_add(ref_node, insert_node, &new_node), "add node");
        REIS(insert_node, new_node, "expects to match");
        RSS(ref_oct_bbox_corner(bbox, corner, xyz), "corner xyz");
        ref_node_xyz(ref_node, 0, new_node) = xyz[0];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2];
        RSS(ref_oct_set_node_at(ref_oct, insert_node, xyz), "set node");
      }
      RUS(REF_EMPTY, ref_oct_c2n(ref_oct, corner, node), "self not set");
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_unique_corner_nodes_node(
              ref_oct, ref_oct_child(ref_oct, child_index, node), box,
              ref_node),
          "recurse");
    }
  }
  return REF_SUCCESS;
}